

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O2

size_t adios2::helper::LinearIndexWithEnd(Dims *start,Dims *end,Dims *point,bool isRowMajor)

{
  pointer puVar1;
  long lVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  
  if ((int)CONCAT71(in_register_00000009,isRowMajor) == 0) {
    lVar4 = 1;
    sVar3 = 0;
    for (lVar5 = 0;
        puVar1 = (pointer)((long)(point->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar5),
        puVar1 != (point->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish; lVar5 = lVar5 + 8) {
      lVar2 = *(long *)((long)(start->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar5);
      sVar3 = sVar3 + (*puVar1 - lVar2) * lVar4;
      lVar4 = lVar4 * ((*(long *)((long)(end->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar5) - lVar2)
                      + 1);
    }
  }
  else {
    puVar1 = (point->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = 1;
    sVar3 = 0;
    for (lVar5 = 0;
        (pointer)((long)puVar1 + lVar5) !=
        (point->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start; lVar5 = lVar5 + -8) {
      lVar2 = *(long *)((long)(start->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish + lVar5 + -8);
      sVar3 = sVar3 + (*(long *)((long)puVar1 + lVar5 + -8) - lVar2) * lVar4;
      lVar4 = lVar4 * ((*(long *)((long)(end->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + lVar5 + -8) -
                       lVar2) + 1);
    }
  }
  return sVar3;
}

Assistant:

size_t LinearIndexWithEnd(const Dims &start, const Dims &end, const Dims &point,
                          const bool isRowMajor) noexcept
{
    auto lf_RowMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.rbegin();
        auto eit = end.rbegin();
        auto pit = point.rbegin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.rend(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    auto lf_ColumnMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.begin();
        auto eit = end.begin();
        auto pit = point.begin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.end(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    size_t linearIndex = MaxSizeT - 1;

    if (isRowMajor)
    {
        linearIndex = lf_RowMajor(start, end, point);
    }
    else
    {
        linearIndex = lf_ColumnMajor(start, end, point);
    }

    return linearIndex;
}